

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O1

bool google::ParseTemplateParam(State *state)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  int iVar5;
  short sVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  char *pcVar10;
  State copy;
  
  pcVar10 = state->mangled_cur;
  if ((*pcVar10 == 'T') && (pcVar10[1] == '_')) {
    pcVar10 = pcVar10 + 2;
LAB_00118d37:
    state->mangled_cur = pcVar10;
    MaybeAppend(state,"?");
    bVar9 = true;
  }
  else {
    pcVar10 = state->mangled_cur;
    pcVar1 = state->out_cur;
    pcVar2 = state->out_begin;
    pcVar3 = state->out_end;
    pcVar4 = state->prev_name;
    iVar5 = state->prev_name_length;
    sVar6 = state->nest_level;
    bVar9 = state->append;
    bVar7 = state->overflowed;
    if (*state->mangled_cur == 'T') {
      state->mangled_cur = state->mangled_cur + 1;
      bVar8 = ParseNumber(state,(int *)0x0);
      if ((bVar8) && (*state->mangled_cur == '_')) {
        pcVar10 = state->mangled_cur + 1;
        goto LAB_00118d37;
      }
    }
    state->prev_name = pcVar4;
    state->prev_name_length = iVar5;
    state->nest_level = sVar6;
    state->append = bVar9;
    state->overflowed = bVar7;
    state->out_begin = pcVar2;
    state->out_end = pcVar3;
    state->mangled_cur = pcVar10;
    state->out_cur = pcVar1;
    bVar9 = false;
  }
  return bVar9;
}

Assistant:

static bool ParseTemplateParam(State *state) {
  if (ParseTwoCharToken(state, "T_")) {
    MaybeAppend(state, "?");  // We don't support template substitutions.
    return true;
  }

  State copy = *state;
  if (ParseOneCharToken(state, 'T') && ParseNumber(state, NULL) &&
      ParseOneCharToken(state, '_')) {
    MaybeAppend(state, "?");  // We don't support template substitutions.
    return true;
  }
  *state = copy;
  return false;
}